

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O0

void VP8WriteProbas(VP8BitWriter *bw,VP8EncProba *probas)

{
  uint8_t uVar1;
  int iVar2;
  long in_RSI;
  int update;
  uint8_t p0;
  int p;
  int c;
  int b;
  int t;
  uint in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < 3;
          in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
        for (in_stack_ffffffffffffffe0 = 0; in_stack_ffffffffffffffe0 < 0xb;
            in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
          uVar1 = *(uint8_t *)
                   (in_RSI + 4 + (long)local_14 * 0x108 + (long)local_18 * 0x21 +
                    (long)in_stack_ffffffffffffffe4 * 0xb + (long)in_stack_ffffffffffffffe0);
          in_stack_ffffffffffffffdc = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffdc);
          in_stack_ffffffffffffffd8 =
               (uint)(uVar1 != VP8CoeffsProba0[local_14][local_18][in_stack_ffffffffffffffe4]
                               [in_stack_ffffffffffffffe0]);
          iVar2 = VP8PutBit((VP8BitWriter *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
          if (iVar2 != 0) {
            VP8PutBits((VP8BitWriter *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                       ,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
          }
        }
      }
    }
  }
  iVar2 = VP8PutBitUniform((VP8BitWriter *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
  if (iVar2 != 0) {
    VP8PutBits((VP8BitWriter *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void VP8WriteProbas(VP8BitWriter* const bw, const VP8EncProba* const probas) {
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const uint8_t p0 = probas->coeffs_[t][b][c][p];
          const int update = (p0 != VP8CoeffsProba0[t][b][c][p]);
          if (VP8PutBit(bw, update, VP8CoeffsUpdateProba[t][b][c][p])) {
            VP8PutBits(bw, p0, 8);
          }
        }
      }
    }
  }
  if (VP8PutBitUniform(bw, probas->use_skip_proba_)) {
    VP8PutBits(bw, probas->skip_proba_, 8);
  }
}